

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

BOOL __thiscall
Js::CustomExternalWrapperObject::SetPropertyTrap
          (CustomExternalWrapperObject *this,Var receiver,SetPropertyTrapKind setPropertyTrapKind,
          JavascriptString *propertyNameString,Var newValue,ScriptContext *requestContext,
          PropertyOperationFlags propertyOperationFlags,PropertyValueInfo *info)

{
  ImplicitCallFlags IVar1;
  ScriptContext *scriptContext;
  Type *pTVar2;
  code *pcVar3;
  ThreadContext *this_00;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  Attributes attributes;
  JavascriptFunction *function;
  undefined4 *puVar7;
  RecyclableObject *ptr;
  Var pvVar8;
  ThreadContext *local_98;
  PropertyRecord *propertyRecord;
  CustomExternalWrapperObject *local_88;
  Var local_80;
  Var local_78;
  Var local_70;
  Var local_68;
  Var local_60;
  Var isPropertyNameNumeric;
  Var propertyNameNumericValue;
  PropertyValueInfo *local_48;
  Var local_40;
  ThreadContext *local_38;
  
  local_48 = info;
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  local_40 = newValue;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  local_38 = requestContext->threadContext;
  propertyNameNumericValue = requestContext;
  BVar6 = EnsureInitialized(this,requestContext);
  if (BVar6 == 0) {
    return 0;
  }
  pTVar2 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  pvVar8 = *(Var *)&(pTVar2[1].propertyCache.ptr)->elements[0].field_0x8;
  if (pvVar8 == (Var)0x0) {
    pvVar8 = CrossSite::MarshalVar
                       ((((pTVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                        scriptContext.ptr,local_40,false);
    BVar6 = DynamicObject::SetProperty
                      (&this->super_DynamicObject,propertyNameString,pvVar8,propertyOperationFlags,
                       (PropertyValueInfo *)0x0);
    return BVar6;
  }
  function = VarTo<Js::JavascriptFunction>(pvVar8);
  bVar4 = ScriptContext::IsHeapEnumInProgress
                    ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                       javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0x27a,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                "!GetScriptContext()->IsHeapEnumInProgress()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  (*(propertyNameString->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x61])
            (propertyNameString,&stack0xffffffffffffff68,0);
  pvVar8 = propertyNameNumericValue;
  local_80 = GetName((CustomExternalWrapperObject *)propertyNameString,
                     (ScriptContext *)propertyNameNumericValue,
                     (local_98->super_DefaultRecyclerCollectionWrapper).
                     super_RecyclerCollectionWrapper._isScriptContextCloseGCPending,&local_60,
                     &isPropertyNameNumeric);
  this_00 = local_38;
  if (local_48 != (PropertyValueInfo *)0x0) {
    local_48->m_instance = (RecyclableObject *)this;
    local_48->m_propertyIndex = 0xffff;
    local_48->m_attributes = '\0';
    local_48->flags = InlineCacheNoFlags;
    *(undefined1 *)&local_48->cacheInfoFlag =
         (char)local_48->cacheInfoFlag | disablePrototypeCacheFlag;
  }
  if (function == (JavascriptFunction *)0x0) {
    return 0;
  }
  local_98 = local_38;
  local_78 = local_60;
  local_70 = isPropertyNameNumeric;
  local_68 = local_40;
  bVar4 = local_38->reentrancySafeOrHandled;
  local_38->reentrancySafeOrHandled = true;
  propertyRecord = (PropertyRecord *)function;
  local_88 = this;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar5 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar5) {
    ptr = (RecyclableObject *)
          anon_func::anon_class_56_7_b8deb65f::operator()
                    ((anon_class_56_7_b8deb65f *)&stack0xffffffffffffff68);
    bVar5 = ThreadContext::IsOnStack(ptr);
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
              super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
      goto LAB_00a0f13a;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this_00->implicitCallFlags;
      ptr = (RecyclableObject *)
            anon_func::anon_class_56_7_b8deb65f::operator()
                      ((anon_class_56_7_b8deb65f *)&stack0xffffffffffffff68);
      this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00a0f13a;
    }
    ptr = (RecyclableObject *)
          anon_func::anon_class_56_7_b8deb65f::operator()
                    ((anon_class_56_7_b8deb65f *)&stack0xffffffffffffff68);
    bVar5 = ThreadContext::IsOnStack(ptr);
  }
  if (bVar5 != false) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00a0f13a:
  this_00->reentrancySafeOrHandled = bVar4;
  BVar6 = JavascriptConversion::ToBoolean(ptr,(ScriptContext *)pvVar8);
  return BVar6;
}

Assistant:

BOOL CustomExternalWrapperObject::SetPropertyTrap(Js::Var receiver, SetPropertyTrapKind setPropertyTrapKind, Js::JavascriptString * propertyNameString, Js::Var newValue, Js::ScriptContext * requestContext, Js::PropertyOperationFlags propertyOperationFlags, Js::PropertyValueInfo* info)
{
    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        const Js::PropertyRecord* propertyRecord;
        propertyNameString->GetPropertyRecord(&propertyRecord);
        return GetName(requestContext, propertyRecord->GetPropertyId(), isPropertyNameNumeric, propertyNameNumericValue);
    };
    auto fn = [&]()->BOOL
    {
        // setting the value could be deferred and now we are on a different context from
        // make sure the value has the same context as the containing object.
        newValue = Js::CrossSite::MarshalVar(this->GetScriptContext(), newValue);
        return DynamicObject::SetProperty(propertyNameString, newValue, propertyOperationFlags, nullptr);
    };
    return SetPropertyTrap(receiver, setPropertyTrapKind, getPropertyName, newValue, requestContext, propertyOperationFlags, FALSE, fn, info);
}